

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O3

FT_Error PCF_Face_Init(FT_Stream stream,FT_Face pcfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  FT_Face stream_00;
  char *__s1;
  FT_Generic_Finalizer p_Var1;
  FT_Error FVar2;
  int iVar3;
  code *__s1_00;
  FT_CharMapRec_ local_40;
  
  FVar2 = pcf_load_font(stream,(PCF_Face)pcfface,(long)face_index);
  if (FVar2 != 0) {
    PCF_Face_Done(pcfface);
    stream_00 = pcfface + 1;
    FVar2 = FT_Stream_OpenGzip((FT_Stream)stream_00,stream);
    if (((char)FVar2 == '\a') ||
       ((FVar2 != 0 && (FVar2 = FT_Stream_OpenLZW((FT_Stream)stream_00,stream), FVar2 != 0)))) {
LAB_00201aa1:
      PCF_Face_Done(pcfface);
      return 2;
    }
    pcfface[1].charmaps = (FT_CharMap *)stream;
    pcfface->stream = (FT_Stream)stream_00;
    FVar2 = pcf_load_font((FT_Stream)stream_00,(PCF_Face)pcfface,(long)face_index);
    if (FVar2 != 0) goto LAB_00201aa1;
  }
  if (face_index < 0) {
    return 0;
  }
  if ((short)face_index != 0) {
    PCF_Face_Done(pcfface);
    return 6;
  }
  __s1 = (char *)pcfface[1].generic.data;
  p_Var1 = pcfface[1].generic.finalizer;
  if ((((__s1 == (char *)0x0 || p_Var1 == (FT_Generic_Finalizer)0x0) ||
       (((byte)*p_Var1 | 0x20) != 0x69)) || (((byte)p_Var1[1] | 0x20) != 0x73)) ||
     (((byte)p_Var1[2] | 0x20) != 0x6f)) {
LAB_00201b68:
    local_40.encoding = FT_ENCODING_NONE;
    local_40.platform_id = 0;
    local_40.encoding_id = 0;
  }
  else {
    __s1_00 = p_Var1 + 3;
    iVar3 = strcmp((char *)__s1_00,"10646");
    if ((iVar3 != 0) &&
       (((iVar3 = strcmp((char *)__s1_00,"8859"), iVar3 != 0 || (*__s1 != '1')) || (__s1[1] != '\0')
        ))) {
      iVar3 = strcmp((char *)__s1_00,"646.1991");
      if (iVar3 != 0) goto LAB_00201b68;
      iVar3 = strcmp(__s1,"IRV");
      local_40.encoding = FT_ENCODING_NONE;
      local_40.platform_id = 0;
      local_40.encoding_id = 0;
      if (iVar3 != 0) goto LAB_00201b74;
    }
    local_40.encoding = FT_ENCODING_UNICODE;
    local_40.platform_id = 3;
    local_40.encoding_id = 1;
  }
LAB_00201b74:
  local_40.face = pcfface;
  FVar2 = FT_CMap_New(&pcf_cmap_class,(FT_Pointer)0x0,&local_40,(FT_CMap_conflict *)0x0);
  return FVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Face_Init( FT_Stream      stream,
                 FT_Face        pcfface,        /* PCF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PCF_Face  face  = (PCF_Face)pcfface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PCF driver\n" ));

    error = pcf_load_font( stream, face, face_index );
    if ( error )
    {
      PCF_Face_Done( pcfface );

#if defined( FT_CONFIG_OPTION_USE_ZLIB )  || \
    defined( FT_CONFIG_OPTION_USE_LZW )   || \
    defined( FT_CONFIG_OPTION_USE_BZIP2 )

#ifdef FT_CONFIG_OPTION_USE_ZLIB
      {
        FT_Error  error2;


        /* this didn't work, try gzip support! */
        FT_TRACE2(( "  ... try gzip stream\n" ));
        error2 = FT_Stream_OpenGzip( &face->comp_stream, stream );
        if ( FT_ERR_EQ( error2, Unimplemented_Feature ) )
          goto Fail;

        error = error2;
      }
#endif /* FT_CONFIG_OPTION_USE_ZLIB */

#ifdef FT_CONFIG_OPTION_USE_LZW
      if ( error )
      {
        FT_Error  error3;


        /* this didn't work, try LZW support! */
        FT_TRACE2(( "  ... try LZW stream\n" ));
        error3 = FT_Stream_OpenLZW( &face->comp_stream, stream );
        if ( FT_ERR_EQ( error3, Unimplemented_Feature ) )
          goto Fail;

        error = error3;
      }
#endif /* FT_CONFIG_OPTION_USE_LZW */

#ifdef FT_CONFIG_OPTION_USE_BZIP2
      if ( error )
      {
        FT_Error  error4;


        /* this didn't work, try Bzip2 support! */
        FT_TRACE2(( "  ... try Bzip2 stream\n" ));
        error4 = FT_Stream_OpenBzip2( &face->comp_stream, stream );
        if ( FT_ERR_EQ( error4, Unimplemented_Feature ) )
          goto Fail;

        error = error4;
      }
#endif /* FT_CONFIG_OPTION_USE_BZIP2 */

      if ( error )
        goto Fail;

      face->comp_source = stream;
      pcfface->stream   = &face->comp_stream;

      stream = pcfface->stream;

      error = pcf_load_font( stream, face, face_index );
      if ( error )
        goto Fail;

#else /* !(FT_CONFIG_OPTION_USE_ZLIB ||
           FT_CONFIG_OPTION_USE_LZW ||
           FT_CONFIG_OPTION_USE_BZIP2) */

      goto Fail;

#endif
    }

    /* PCF cannot have multiple faces in a single font file.
     * XXX: A non-zero face_index is already an invalid argument, but
     *      Type1, Type42 drivers have a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index < 0 )
      goto Exit;
    else if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "PCF_Face_Init: invalid face index\n" ));
      PCF_Face_Done( pcfface );
      return FT_THROW( Invalid_Argument );
    }

    /* set up charmap */
    {
      FT_String  *charset_registry = face->charset_registry;
      FT_String  *charset_encoding = face->charset_encoding;
      FT_Bool     unicode_charmap  = 0;


      if ( charset_registry && charset_encoding )
      {
        char*  s = charset_registry;


        /* Uh, oh, compare first letters manually to avoid dependency
           on locales. */
        if ( ( s[0] == 'i' || s[0] == 'I' ) &&
             ( s[1] == 's' || s[1] == 'S' ) &&
             ( s[2] == 'o' || s[2] == 'O' ) )
        {
          s += 3;
          if ( !ft_strcmp( s, "10646" )                      ||
               ( !ft_strcmp( s, "8859" ) &&
                 !ft_strcmp( face->charset_encoding, "1" ) ) )
            unicode_charmap = 1;
          /* another name for ASCII */
          else if ( !ft_strcmp( s, "646.1991" )                 &&
                    !ft_strcmp( face->charset_encoding, "IRV" ) )
            unicode_charmap = 1;
        }
      }

      {
        FT_CharMapRec  charmap;


        charmap.face        = FT_FACE( face );
        charmap.encoding    = FT_ENCODING_NONE;
        /* initial platform/encoding should indicate unset status? */
        charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
        charmap.encoding_id = TT_APPLE_ID_DEFAULT;

        if ( unicode_charmap )
        {
          charmap.encoding    = FT_ENCODING_UNICODE;
          charmap.platform_id = TT_PLATFORM_MICROSOFT;
          charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        }

        error = FT_CMap_New( &pcf_cmap_class, NULL, &charmap, NULL );
      }
    }

  Exit:
    return error;

  Fail:
    FT_TRACE2(( "  not a PCF file\n" ));
    PCF_Face_Done( pcfface );
    error = FT_THROW( Unknown_File_Format );  /* error */
    goto Exit;
  }